

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::get_minmax
              (vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc,vm_rcdesc *rc,int sense,
              int want_index)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  vm_val_t *pvVar4;
  int *in_RCX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  int in_R9D;
  int cmp;
  vm_val_t ele;
  int i;
  vm_val_t winner;
  int winner_idx;
  int cnt;
  vm_val_t *cb;
  uint argc;
  int iVar5;
  int iVar6;
  int in_stack_ffffffffffffff7c;
  vm_val_t *in_stack_ffffffffffffff80;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint argc_00;
  vm_val_t *in_stack_ffffffffffffff98;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffa0;
  anon_union_8_8_cb74652f_for_val aVar7;
  uint local_58;
  vm_val_t *local_50;
  
  if (in_RCX == (int *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = *in_RCX;
  }
  iVar6 = iVar5;
  if ((get_minmax(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,vm_rcdesc_const*,int,int)::
       desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&get_minmax(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,vm_rcdesc_const*,int,int)
                                   ::desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&get_minmax::desc,0,1);
    __cxa_guard_release(&get_minmax(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*,vm_rcdesc_const*,int,int)
                         ::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)in_stack_ffffffffffffff88.native_desc,
                     &in_stack_ffffffffffffff80->typ,
                     (CVmNativeCodeDesc *)CONCAT44(in_stack_ffffffffffffff7c,iVar6));
  if (iVar2 == 0) {
    local_50 = (vm_val_t *)0x0;
    if (iVar5 != 0) {
      local_50 = CVmStack::get(0);
      iVar2 = vm_val_t::is_func_ptr
                        ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (iVar2 == 0) {
        err_throw(0);
      }
    }
    CVmStack::push(in_RSI);
    sVar3 = vmb_get_len((char *)0x37140e);
    if ((int)sVar3 == 0) {
      err_throw(0);
    }
    local_58 = 0;
    for (argc_00 = 0; (int)argc_00 < (int)sVar3; argc_00 = argc_00 + 1) {
      get_element_const((char *)in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,iVar6),
                        (vm_val_t *)0x371455);
      pvVar4 = in_stack_ffffffffffffff98;
      aVar7 = in_stack_ffffffffffffffa0;
      if (local_50 != (vm_val_t *)0x0) {
        CVmStack::push((vm_val_t *)&stack0xffffffffffffff80);
        CVmRun::call_func_ptr
                  ((CVmRun *)in_stack_ffffffffffffffa0.native_desc,in_stack_ffffffffffffff98,argc_00
                   ,(vm_rcdesc *)in_stack_ffffffffffffff88.native_desc,
                   (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        pvVar4 = CVmRun::get_r0();
        in_stack_ffffffffffffff80 = *(vm_val_t **)pvVar4;
        in_stack_ffffffffffffff88 = (anon_union_8_8_cb74652f_for_val)(pvVar4->val).native_desc;
        pvVar4 = in_stack_ffffffffffffff98;
        aVar7 = in_stack_ffffffffffffffa0;
      }
      in_stack_ffffffffffffff98 = in_stack_ffffffffffffff80;
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff88;
      uVar1 = argc_00;
      if ((argc_00 != 0) &&
         (((in_stack_ffffffffffffff7c =
                 vm_val_t::compare_to
                           ((vm_val_t *)in_stack_ffffffffffffff88.native_desc,
                            in_stack_ffffffffffffff80), 0 < in_R9D &&
           (0 < in_stack_ffffffffffffff7c)) ||
          ((in_stack_ffffffffffffff98 = pvVar4, in_stack_ffffffffffffffa0 = aVar7, uVar1 = local_58,
           in_R9D < 0 && (in_stack_ffffffffffffff7c < 0)))))) {
        in_stack_ffffffffffffff98 = in_stack_ffffffffffffff80;
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff88;
        uVar1 = argc_00;
      }
      local_58 = uVar1;
    }
    CVmStack::discard(iVar5 + 1);
    if (ele.typ == 0) {
      *(vm_val_t **)in_RDI = in_stack_ffffffffffffff98;
      (in_RDI->val).native_desc = (CVmNativeCodeDesc *)in_stack_ffffffffffffffa0;
    }
    else {
      vm_val_t::set_int(in_RDI,local_58 + 1);
    }
  }
  return 1;
}

Assistant:

int CVmObjList::get_minmax(VMG_ vm_val_t *retval,
                           const vm_val_t *self_val,
                           const char *lst, uint *in_argc,
                           const vm_rcdesc *rc, int sense, int want_index)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'func' argument is valid */
    const vm_val_t *cb = 0;
    if (argc >= 1)
    {
        cb = G_stk->get(0);
        if (!cb->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push(self_val);

    /* if there are no elements, this is an error */
    int cnt = vmb_get_len(lst);
    if (cnt == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* we don't have a winner yet */
    int winner_idx = 0;
    vm_val_t winner;

    /* run through the list */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* get this element */
        vm_val_t ele;
        get_element_const(lst, i, &ele);

        /* if there's a callback, invoke it */
        if (cb != 0)
        {
            /* invoke the callback with the element value as the argument */
            G_stk->push(&ele);
            G_interpreter->call_func_ptr(vmg_ cb, 1, rc, 0);

            /* use the result as the comparison value */
            ele = *G_interpreter->get_r0();
        }

        /* compare it to the winner so far, and keep the lower value */
        if (i == 0)
        {
            /* it's the first element, so it's the default winner so far */
            winner_idx = i;
            winner = ele;
        }
        else
        {
            /* compare it to the winner so far */
            int cmp = ele.compare_to(vmg_ &winner);

            /* keep it if it's the min/max so far */
            if ((sense > 0 && cmp > 0) || (sense < 0 && cmp < 0))
            {
                winner_idx = i;
                winner = ele;
            }
        }
    }

    /* remove gc protection and arguments */
    G_stk->discard(argc + 1);
    
    /* return the winning index (note: 1-based) or value, as desired */
    if (want_index)
        retval->set_int(winner_idx + 1);
    else
        *retval = winner;
        
    /* handled */
    return TRUE;
}